

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O2

void __thiscall AstWalker::visitStatementAstNode(AstWalker *this,StatementAstNode *node)

{
  long lVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar2;
  string local_40;
  allocator<char> local_19;
  
  if (node != (StatementAstNode *)0x0) {
    lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&DeclareStatementAstNode::typeinfo,0);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&AssignStatementAstNode::typeinfo,0);
      if (lVar1 == 0) {
        lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&IfStatementAstNode::typeinfo,0);
        if (lVar1 == 0) {
          lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&WhileStatementAstNode::typeinfo,0
                                );
          if (lVar1 == 0) {
            lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&BreakStatementAstNode::typeinfo
                                   ,0);
            if (lVar1 == 0) {
              lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                     &ReturnStatementAstNode::typeinfo,0);
              if (lVar1 == 0) {
                lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                       &BlockStatementAstNode::typeinfo,0);
                if (lVar1 == 0) {
                  lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                         &ExpressionStatementAstNode::typeinfo,0);
                  if (lVar1 == 0) goto LAB_0010a753;
                  UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0x12];
                  uVar2 = extraout_RDX_06;
                }
                else {
                  UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xb];
                  uVar2 = extraout_RDX_05;
                }
              }
              else {
                UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[10];
                uVar2 = extraout_RDX_04;
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[9];
              uVar2 = extraout_RDX_03;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[8];
            uVar2 = extraout_RDX_02;
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[7];
          uVar2 = extraout_RDX_01;
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[6];
        uVar2 = extraout_RDX_00;
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[5];
      uVar2 = extraout_RDX;
    }
    (*UNRECOVERED_JUMPTABLE)(this,lVar1,uVar2,UNRECOVERED_JUMPTABLE);
    return;
  }
LAB_0010a753:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"visitStatementAstNode called with unexpected node type",&local_19)
  ;
  Error::assertWithPanic(false,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void AstWalker::visitStatementAstNode(StatementAstNode* node) noexcept {

  auto declare = dynamic_cast<DeclareStatementAstNode*>(node);
  if (declare != nullptr) {
    this->visitDeclareStatementAstNode(declare);
    return;
  }

  auto assign = dynamic_cast<AssignStatementAstNode*>(node);
  if (assign != nullptr) {
    this->visitAssignStatementAstNode(assign);
    return;
  }

  auto ifStmt = dynamic_cast<IfStatementAstNode*>(node);
  if (ifStmt != nullptr) {
    this->visitIfStatementAstNode(ifStmt);
    return;
  }

  auto whileStmt = dynamic_cast<WhileStatementAstNode*>(node);
  if (whileStmt != nullptr) {
    this->visitWhileStatementAstNode(whileStmt);
    return;
  }

  auto breakStmt = dynamic_cast<BreakStatementAstNode*>(node);
  if (breakStmt != nullptr) {
    this->visitBreakStatementAstNode(breakStmt);
    return;
  }

  auto returnStmt = dynamic_cast<ReturnStatementAstNode*>(node);
  if (returnStmt != nullptr) {
    this->visitReturnStatementAstNode(returnStmt);
    return;
  }

  auto block = dynamic_cast<BlockStatementAstNode*>(node);
  if (block != nullptr) {
    this->visitBlockStatementAstNode(block);
    return;
  }

  auto expr = dynamic_cast<ExpressionStatementAstNode*>(node);
  if (expr != nullptr) {
    this->visitExpressionStatementAstNode(expr);
    return;
  }

  Error::assertWithPanic(false, "visitStatementAstNode called with unexpected node type");
}